

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::set_port_filter(session_impl *this,port_filter *f)

{
  bool bVar1;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end2;
  iterator __begin2;
  torrent_list<libtorrent::aux::torrent> *__range2;
  port_filter *f_local;
  session_impl *this_local;
  
  port_filter::operator=(&this->m_port_filter,f);
  __end2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
  t = (shared_ptr<libtorrent::aux::torrent> *)
      torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                 ::operator*(&__end2);
    this_01 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    torrent::port_filter_updated(this_01);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::set_port_filter(port_filter const& f)
	{
		m_port_filter = f;
		// Close connections whose endpoint is filtered
		// by the new port-filter
		for (auto const& t : m_torrents)
			t->port_filter_updated();
	}